

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O3

int mallocAndStrcpy_s(char **destination,char *source)

{
  size_t sVar1;
  char *__dest;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0x16;
  if (source != (char *)0x0 && destination != (char **)0x0) {
    sVar1 = strlen(source);
    uVar3 = sVar1 + 1;
    sVar1 = 0xffffffffffffffff;
    if (uVar3 != 0) {
      sVar1 = uVar3;
    }
    iVar2 = 0xc;
    if ((sVar1 != 0xffffffffffffffff) && (__dest = (char *)malloc(sVar1), __dest != (char *)0x0)) {
      *destination = __dest;
      if (uVar3 != 0) {
        sVar1 = strlen(source);
        if (sVar1 + 1 <= uVar3) {
          memcpy(__dest,source,sVar1 + 1);
          return 0;
        }
      }
      free(__dest);
      *destination = (char *)0x0;
      iVar2 = 0x22;
    }
  }
  return iVar2;
}

Assistant:

int mallocAndStrcpy_s(char** destination, const char* source)
{
    int result;
    int copied_result;
    /*Codes_SRS_CRT_ABSTRACTIONS_99_036: [destination parameter or source parameter is NULL, the error code returned shall be EINVAL and destination shall not be modified.]*/
    if ((destination == NULL) || (source == NULL))
    {
        /*If strDestination or strSource is a NULL pointer[...]these functions return EINVAL */
        result = EINVAL;
    }
    else
    {
        char* temp;
        size_t l = strlen(source);
        size_t malloc_size = safe_add_size_t(l, 1);

        /*Codes_SRS_CRT_ABSTRACTIONS_99_037: [Upon failure to allocate memory for the destination, the function will return ENOMEM.]*/
        if (malloc_size == SIZE_MAX ||
            (temp = (char*)malloc(malloc_size)) == NULL)
        {
            result = ENOMEM;
        }
        else
        {
            *destination = temp;
            /*Codes_SRS_CRT_ABSTRACTIONS_99_039: [mallocAndstrcpy_s shall copy the contents in the address source, including the terminating null character into location specified by the destination pointer after the memory allocation.]*/
            copied_result = strcpy_s(*destination, l + 1, source);
            if (copied_result != 0) /*strcpy_s error*/
            {
                free(*destination);
                *destination = NULL;
                result = copied_result;
            }
            else
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_99_035: [mallocAndstrcpy_s shall return Zero upon success]*/
                result = 0;
            }
        }
    }
    return result;
}